

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall vector<vector<vector<int>_>_>::vector(vector<vector<vector<int>_>_> *this)

{
  undefined8 *puVar1;
  vector<vector<int>_> *local_28;
  vector<vector<vector<int>_>_> *this_local;
  
  puVar1 = (undefined8 *)operator_new__(0x18);
  *puVar1 = 1;
  local_28 = (vector<vector<int>_> *)(puVar1 + 1);
  do {
    vector<vector<int>_>::vector(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != (vector<vector<int>_> *)(puVar1 + 3));
  this->vect = (vector<vector<int>_> *)(puVar1 + 1);
  this->_size = 0;
  this->_capacity = 1;
  return;
}

Assistant:

vector() {
        vect = new T[1]();
        _size = 0;
        _capacity = 1;
    }